

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
Lodtalk::InstanceVariableScope::InstanceVariableScope
          (InstanceVariableScope *this,EvaluationScopePtr *parent,
          Ref<Lodtalk::ClassDescription> *classDesc)

{
  _Rb_tree_header *p_Var1;
  
  EvaluationScope::EvaluationScope(&this->super_EvaluationScope,parent);
  (this->super_EvaluationScope)._vptr_EvaluationScope =
       (_func_int **)&PTR__InstanceVariableScope_00170750;
  Ref<Lodtalk::ClassDescription>::Ref(&this->classDesc,classDesc);
  p_Var1 = &(this->lookupCache)._M_t._M_impl.super__Rb_tree_header;
  (this->lookupCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->lookupCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lookupCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->lookupCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->lookupCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

InstanceVariableScope(const EvaluationScopePtr &parent, const Ref<ClassDescription> &classDesc)
		: EvaluationScope(parent), classDesc(classDesc) {}